

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::init
          (SamplePosRasterizationTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  RenderTarget *pRVar4;
  NotSupportedError *pNVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  reference pvVar8;
  float *pfVar9;
  TestError *this_00;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  allocator<char> local_8c1;
  string local_8c0;
  MessageBuilder local_8a0;
  int local_720;
  float fStack_71c;
  int sampleNdx;
  float local_714;
  float fStack_710;
  Vector<float,_4> local_70c;
  Vector<float,_4> local_6fc;
  undefined1 local_6ec [8];
  Triangle tri_3;
  Vector<float,_4> local_6ac;
  Vector<float,_4> local_69c;
  undefined1 local_68c [8];
  Triangle tri_2;
  Vec2 d;
  Vec2 p;
  int i_2;
  Vector<float,_4> local_638;
  Vector<float,_4> local_628;
  undefined1 local_618 [8];
  Triangle tri_1;
  int i_1;
  Vector<float,_4> local_5d4;
  Vector<float,_4> local_5c4;
  undefined1 local_5b4 [8];
  Triangle tri;
  int i;
  MessageBuilder local_400;
  MessageBuilder local_280;
  undefined1 local_fa;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d1;
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  long lStack_18;
  GLint maxSamples;
  Functions *gl;
  SamplePosRasterizationTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  local_1c = 0;
  pRVar4 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar4);
  if (this->m_canvasSize <= iVar1) {
    pRVar4 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = tcu::RenderTarget::getHeight(pRVar4);
    if (this->m_canvasSize <= iVar1) {
      (**(code **)(lStack_18 + 0x868))(0x910e,&local_1c);
      if (local_1c < this->m_samples) {
        local_fa = 1;
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,
                   "Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES",&local_f9);
        tcu::NotSupportedError::NotSupportedError(pNVar5,&local_f8);
        local_fa = 0;
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_280,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_280,(char (*) [32])"GL_MAX_COLOR_TEXTURE_SAMPLES = ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1c);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_280);
      (**(code **)(lStack_18 + 0x868))(0xd50,&this->m_subpixelBits);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_400,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_400,(char (*) [20])"GL_SUBPIXEL_BITS = ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_subpixelBits);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_400);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      pMVar7 = (MessageBuilder *)(tri.p3.m_data + 3);
      tcu::TestLog::operator<<(pMVar7,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [29])"Creating multisample texture")
      ;
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(tri.p3.m_data + 3));
      (**(code **)(lStack_18 + 0x6f8))(1,&this->m_texID);
      (**(code **)(lStack_18 + 0xb8))(0x9100,this->m_texID);
      (**(code **)(lStack_18 + 0x1390))
                (0x9100,this->m_samples,0x8058,this->m_canvasSize,this->m_canvasSize,1);
      dVar2 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar2,"texStorage2DMultisample",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xe3);
      (**(code **)(lStack_18 + 0x708))(1,&this->m_vaoID);
      (**(code **)(lStack_18 + 0xd8))(this->m_vaoID);
      dVar2 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar2,"bindVertexArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xe7);
      (**(code **)(lStack_18 + 0x6c8))(1,&this->m_vboID);
      (**(code **)(lStack_18 + 0x40))(0x8892,this->m_vboID);
      dVar2 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar2,"bindBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xeb);
      for (tri.p3.m_data[2] = 0.0; (int)tri.p3.m_data[2] < 0x14;
          tri.p3.m_data[2] = (float)((int)tri.p3.m_data[2] + 1)) {
        Triangle::Triangle((Triangle *)local_5b4);
        tcu::Vector<float,_4>::Vector
                  (&local_5c4,
                   ((float)(int)tri.p3.m_data[2] + 1.0 / (float)((int)tri.p3.m_data[2] + 1)) / 20.0,
                   0.0,0.0,1.0);
        local_5b4._0_4_ = local_5c4.m_data[0];
        local_5b4._4_4_ = local_5c4.m_data[1];
        tri.p1.m_data[0] = local_5c4.m_data[2];
        tri.p1.m_data[1] = local_5c4.m_data[3];
        tcu::Vector<float,_4>::Vector
                  (&local_5d4,
                   ((float)(int)tri.p3.m_data[2] + 0.3 + 1.0 / (float)((int)tri.p3.m_data[2] + 1)) /
                   20.0,0.0,0.0,1.0);
        tri.p1.m_data[2] = local_5d4.m_data[0];
        tri.p1.m_data[3] = local_5d4.m_data[1];
        tri.p2.m_data[0] = local_5d4.m_data[2];
        tri.p2.m_data[1] = local_5d4.m_data[3];
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(tri_1.p3.m_data + 3),
                   ((float)(int)tri.p3.m_data[2] + 1.0 / (float)((int)tri.p3.m_data[2] + 1)) / 20.0,
                   -1.0,0.0,1.0);
        tri.p2.m_data[2] = tri_1.p3.m_data[3];
        tri.p2.m_data[3] = (float)i_1;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(&this->m_testTriangles,(value_type *)local_5b4);
      }
      for (tri_1.p3.m_data[2] = 0.0; (int)tri_1.p3.m_data[2] < 0x14;
          tri_1.p3.m_data[2] = (float)((int)tri_1.p3.m_data[2] + 1)) {
        Triangle::Triangle((Triangle *)local_618);
        tcu::Vector<float,_4>::Vector
                  (&local_628,-1.0,
                   ((float)(int)tri_1.p3.m_data[2] + 1.0 / (float)((int)tri_1.p3.m_data[2] + 1)) /
                   20.0,0.0,1.0);
        local_618._0_4_ = local_628.m_data[0];
        local_618._4_4_ = local_628.m_data[1];
        tri_1.p1.m_data[0] = local_628.m_data[2];
        tri_1.p1.m_data[1] = local_628.m_data[3];
        tcu::Vector<float,_4>::Vector
                  (&local_638,-1.0,
                   ((float)(int)tri_1.p3.m_data[2] + 0.3 +
                   1.0 / (float)((int)tri_1.p3.m_data[2] + 1)) / 20.0,0.0,1.0);
        tri_1.p1.m_data[2] = local_638.m_data[0];
        tri_1.p1.m_data[3] = local_638.m_data[1];
        tri_1.p2.m_data[0] = local_638.m_data[2];
        tri_1.p2.m_data[1] = local_638.m_data[3];
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(p.m_data + 1),0.0,
                   ((float)(int)tri_1.p3.m_data[2] + 1.0 / (float)((int)tri_1.p3.m_data[2] + 1)) /
                   20.0,0.0,1.0);
        tri_1.p2.m_data[2] = p.m_data[1];
        tri_1.p2.m_data[3] = (float)i_2;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(&this->m_testTriangles,(value_type *)local_618);
      }
      for (p.m_data[0] = 0.0; (int)p.m_data[0] < 0x14; p.m_data[0] = (float)((int)p.m_data[0] + 1))
      {
        fVar10 = ::deFloatCos(((float)(int)p.m_data[0] / 20.0) * 3.1415927 * 2.0);
        fVar11 = ::deFloatSin(((float)(int)p.m_data[0] / 20.0) * 3.1415927 * 2.0);
        tcu::Vector<float,_2>::Vector(&d,fVar10 * 0.5 + 0.5,fVar11 * 0.5 + 0.5);
        tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(tri_2.p3.m_data + 2),0.1,0.02);
        Triangle::Triangle((Triangle *)local_68c);
        tcu::Vector<float,_4>::Vector(&local_69c,0.4,0.4,0.0,1.0);
        local_68c._0_4_ = local_69c.m_data[0];
        local_68c._4_4_ = local_69c.m_data[1];
        tri_2.p1.m_data[0] = local_69c.m_data[2];
        tri_2.p1.m_data[1] = local_69c.m_data[3];
        fVar10 = tcu::Vector<float,_2>::x(&d);
        fVar11 = tcu::Vector<float,_2>::y(&d);
        tcu::Vector<float,_4>::Vector(&local_6ac,fVar10,fVar11,0.0,1.0);
        tri_2.p1.m_data[2] = local_6ac.m_data[0];
        tri_2.p1.m_data[3] = local_6ac.m_data[1];
        tri_2.p2.m_data[0] = local_6ac.m_data[2];
        tri_2.p2.m_data[1] = local_6ac.m_data[3];
        fVar10 = tcu::Vector<float,_2>::x(&d);
        fVar11 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(tri_2.p3.m_data + 2));
        fVar12 = tcu::Vector<float,_2>::y(&d);
        fVar13 = tcu::Vector<float,_2>::y((Vector<float,_2> *)(tri_2.p3.m_data + 2));
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(tri_3.p3.m_data + 2),fVar10 + fVar11,fVar12 + fVar13,0.0,1.0
                  );
        tri_2.p2.m_data[2] = tri_3.p3.m_data[2];
        tri_2.p2.m_data[3] = tri_3.p3.m_data[3];
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(&this->m_testTriangles,(value_type *)local_68c);
      }
      Triangle::Triangle((Triangle *)local_6ec);
      tcu::Vector<float,_4>::Vector(&local_6fc,-0.202,-0.202,0.0,1.0);
      local_6ec._0_4_ = local_6fc.m_data[0];
      local_6ec._4_4_ = local_6fc.m_data[1];
      tri_3.p1.m_data[0] = local_6fc.m_data[2];
      tri_3.p1.m_data[1] = local_6fc.m_data[3];
      tcu::Vector<float,_4>::Vector(&local_70c,-0.802,-0.202,0.0,1.0);
      tri_3.p1.m_data[2] = local_70c.m_data[0];
      tri_3.p1.m_data[3] = local_70c.m_data[1];
      tri_3.p2.m_data[0] = local_70c.m_data[2];
      tri_3.p2.m_data[1] = local_70c.m_data[3];
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&stack0xfffffffffffff8e4,-0.802,-0.802,0.0,1.0);
      tri_3.p2.m_data[2] = fStack_71c;
      tri_3.p2.m_data[3] = (float)sampleNdx;
      tri_3.p3.m_data[0] = local_714;
      tri_3.p3.m_data[1] = fStack_710;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
      ::push_back(&this->m_testTriangles,(value_type *)local_6ec);
      genMultisampleTexture(this);
      local_720 = 0;
      while( true ) {
        if (this->m_samples <= local_720) {
          genSamplerProgram(this);
          return extraout_EAX;
        }
        pvVar8 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[](&this->m_samplePositions,(long)local_720);
        pfVar9 = tcu::Vector<float,_2>::x(pvVar8);
        if (*pfVar9 <= 0.0 && *pfVar9 != 0.0) break;
        pvVar8 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[](&this->m_samplePositions,(long)local_720);
        pfVar9 = tcu::Vector<float,_2>::x(pvVar8);
        if (1.0 < *pfVar9) break;
        pvVar8 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[](&this->m_samplePositions,(long)local_720);
        pfVar9 = tcu::Vector<float,_2>::y(pvVar8);
        if (*pfVar9 <= 0.0 && *pfVar9 != 0.0) break;
        pvVar8 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[](&this->m_samplePositions,(long)local_720);
        pfVar9 = tcu::Vector<float,_2>::y(pvVar8);
        if (1.0 < *pfVar9) break;
        local_720 = local_720 + 1;
      }
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_8a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_8a0,(char (*) [37])"// ERROR: Sample position of sample ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_720);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [43])" should be in range ([0, 1], [0, 1]). Got ");
      pvVar8 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
               operator[](&this->m_samplePositions,(long)local_720);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar8);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8a0);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8c0,"invalid sample position",&local_8c1);
      tcu::TestError::TestError(this_00,&local_8c0);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  local_d1 = 1;
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_a0,&this->m_canvasSize);
  std::operator+(&local_80,"render target size must be at least ",&local_a0);
  std::operator+(&local_60,&local_80,"x");
  de::toString<int>(&local_d0,&this->m_canvasSize);
  std::operator+(&local_40,&local_60,&local_d0);
  tcu::NotSupportedError::NotSupportedError(pNVar5,&local_40);
  local_d1 = 0;
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void SamplePosRasterizationTest::init (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	GLint					maxSamples	= 0;

	// requirements

	if (m_context.getRenderTarget().getWidth() < m_canvasSize || m_context.getRenderTarget().getHeight() < m_canvasSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(m_canvasSize) + "x" + de::toString(m_canvasSize));

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &maxSamples);
	if (m_samples > maxSamples)
		throw tcu::NotSupportedError("Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_COLOR_TEXTURE_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;

	gl.getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);
	m_testCtx.getLog() << tcu::TestLog::Message << "GL_SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;

	// generate textures & other gl stuff

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample texture" << tcu::TestLog::EndMessage;

	gl.genTextures				(1, &m_texID);
	gl.bindTexture				(GL_TEXTURE_2D_MULTISAMPLE, m_texID);
	gl.texStorage2DMultisample	(GL_TEXTURE_2D_MULTISAMPLE, m_samples, GL_RGBA8, m_canvasSize, m_canvasSize, GL_TRUE);
	GLU_EXPECT_NO_ERROR			(gl.getError(), "texStorage2DMultisample");

	gl.genVertexArrays		(1, &m_vaoID);
	gl.bindVertexArray		(m_vaoID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "bindVertexArray");

	gl.genBuffers			(1, &m_vboID);
	gl.bindBuffer			(GL_ARRAY_BUFFER, m_vboID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "bindBuffer");

	// generate test scene
	for (int i = 0; i < 20; ++i)
	{
		// vertical spikes
		Triangle tri;
		tri.p1 = tcu::Vec4(((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	 0.0f,	0.0f,	1.0f);
		tri.p2 = tcu::Vec4(((float)i + 0.3f + 1.0f / (float)(i + 1)) / 20.0f,	 0.0f,	0.0f,	1.0f);
		tri.p3 = tcu::Vec4(((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	-1.0f,	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}
	for (int i = 0; i < 20; ++i)
	{
		// horisontal spikes
		Triangle tri;
		tri.p1 = tcu::Vec4(-1.0f,	((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		tri.p2 = tcu::Vec4(-1.0f,	((float)i + 0.3f + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		tri.p3 = tcu::Vec4( 0.0f,	((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}

	for (int i = 0; i < 20; ++i)
	{
		// fan
		const tcu::Vec2 p = tcu::Vec2(deFloatCos(((float)i)/20.0f*DE_PI*2) * 0.5f + 0.5f, deFloatSin(((float)i)/20.0f*DE_PI*2) * 0.5f + 0.5f);
		const tcu::Vec2 d = tcu::Vec2(0.1f, 0.02f);

		Triangle tri;
		tri.p1 = tcu::Vec4(0.4f,			0.4f,			0.0f,	1.0f);
		tri.p2 = tcu::Vec4(p.x(),			p.y(),			0.0f,	1.0f);
		tri.p3 = tcu::Vec4(p.x() + d.x(),	p.y() + d.y(),	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}
	{
		Triangle tri;
		tri.p1 = tcu::Vec4(-0.202f, -0.202f, 0.0f, 1.0f);
		tri.p2 = tcu::Vec4(-0.802f, -0.202f, 0.0f, 1.0f);
		tri.p3 = tcu::Vec4(-0.802f, -0.802f, 0.0f, 1.0f);
		m_testTriangles.push_back(tri);
	}

	// generate multisample texture (and query the sample positions in it)
	genMultisampleTexture();

	// verify queried samples are in a valid range
	for (int sampleNdx = 0; sampleNdx < m_samples; ++sampleNdx)
	{
		if (m_samplePositions[sampleNdx].x() < 0.0f || m_samplePositions[sampleNdx].x() > 1.0f ||
			m_samplePositions[sampleNdx].y() < 0.0f || m_samplePositions[sampleNdx].y() > 1.0f)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: Sample position of sample " << sampleNdx << " should be in range ([0, 1], [0, 1]). Got " << m_samplePositions[sampleNdx] << tcu::TestLog::EndMessage;
			throw tcu::TestError("invalid sample position");
		}
	}

	// generate sampler program
	genSamplerProgram();
}